

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression cnn::expr::pick(Expression *x,vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  ComputationGraph *arguments;
  undefined8 extraout_RDX;
  Expression EVar1;
  uint local_24;
  uint *local_20;
  pointer local_18;
  
  arguments = (ComputationGraph *)
              (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_24 = *(uint *)&(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
  local_20 = &local_24;
  local_18 = (pointer)0x1;
  ComputationGraph::
  add_function<cnn::PickElement,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
            ((ComputationGraph *)&x->i,(initializer_list<cnn::VariableIndex> *)arguments,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_20);
  x->pg = arguments;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)x;
  return EVar1;
}

Assistant:

Expression pick(const Expression& x, const vector<unsigned> & v) { return Expression(x.pg, x.pg->add_function<PickElement>({x.i}, v)); }